

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

TypedValue * ToWabtValue(TypedValue *__return_storage_ptr__,wasm_val_t *value)

{
  Value *pVVar1;
  FILE *__stream;
  ValueType VVar2;
  anon_union_8_5_30786955_for_of *paVar3;
  anon_union_8_5_30786955_for_of aVar4;
  TypedValue *tv;
  string local_38;
  
  pVVar1 = &__return_storage_ptr__->value;
  (__return_storage_ptr__->value).field_0.i64_ = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->value).field_0 + 8) = 0;
  VVar2 = ToWabtValueType(value->kind);
  __return_storage_ptr__->type = VVar2;
  switch(value->kind) {
  case '\0':
    (pVVar1->field_0).i32_ = (value->of).i32;
    break;
  case '\x01':
    aVar4 = value->of;
    goto LAB_001c5505;
  case '\x02':
    (pVVar1->field_0).i32_ = (value->of).i32;
    break;
  case '\x03':
    (pVVar1->field_0).i64_ = (u64)value->of;
    break;
  default:
    if (1 < value->kind - 0x80) {
      fprintf(_stderr,"CAPI: [%s] unexpected wasm type: %d\n","ToWabtValue");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc"
                    ,0x1b1,"TypedValue ToWabtValue(const wasm_val_t &)");
    }
    if ((value->of).ref == (wasm_ref_t *)0x0) {
      paVar3 = (anon_union_8_5_30786955_for_of *)&wabt::interp::Ref::Null;
    }
    else {
      paVar3 = (anon_union_8_5_30786955_for_of *)&((((value->of).ref)->I).obj_)->self_;
    }
    aVar4 = *paVar3;
LAB_001c5505:
    (pVVar1->field_0).i64_ = (u64)aVar4;
  }
  __stream = _stderr;
  wabt::interp::TypedValueToString_abi_cxx11_(&local_38,(interp *)__return_storage_ptr__,tv);
  fprintf(__stream,"CAPI: [%s] -> %s\n","ToWabtValue",local_38._M_dataplus._M_p);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

static TypedValue ToWabtValue(const wasm_val_t& value) {
  TypedValue out;
  out.type = ToWabtValueType(value.kind);
  switch (value.kind) {
    case WASM_I32:
      out.value.Set(value.of.i32);
      break;
    case WASM_I64:
      out.value.Set(value.of.i64);
      break;
    case WASM_F32:
      out.value.Set(value.of.f32);
      break;
    case WASM_F64:
      out.value.Set(value.of.f64);
      break;
    case WASM_ANYREF:
    case WASM_FUNCREF:
      out.value.Set(value.of.ref ? value.of.ref->I->self() : Ref::Null);
      break;
    default:
      TRACE("unexpected wasm type: %d", value.kind);
      assert(false);
  }
  TRACE("-> %s", TypedValueToString(out).c_str());
  return out;
}